

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O2

ze_result_t validation_layer::logAndPropagateResult(char *fname,ze_result_t result)

{
  Logger *this;
  ze_result_t in_EDX;
  allocator local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if (result != ZE_RESULT_SUCCESS) {
    this = *(Logger **)(context + 0xd50);
    loader::to_string_abi_cxx11_(&local_40,(loader *)(ulong)result,in_EDX);
    std::operator+(&local_a0,"Error (",&local_40);
    std::operator+(&local_80,&local_a0,") in ");
    std::__cxx11::string::string((string *)&local_c0,fname,&local_c1);
    std::operator+(&local_60,&local_80,&local_c0);
    loader::Logger::log_trace(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return result;
}

Assistant:

static ze_result_t logAndPropagateResult(const char* fname, ze_result_t result) {
        if (result != ZE_RESULT_SUCCESS) {
            context.logger->log_trace("Error (" + loader::to_string(result) + ") in " + std::string(fname));
        }
        return result;
    }